

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_portal.h
# Opt level: O0

void __thiscall GLPortal::GLPortal(GLPortal *this,bool local)

{
  TVector3<double> *local_38;
  GLPortal *local_30 [3];
  byte local_11;
  GLPortal *pGStack_10;
  bool local_local;
  GLPortal *this_local;
  
  this->_vptr_GLPortal = (_func_int **)&PTR__GLPortal_00b66968;
  local_11 = local;
  pGStack_10 = this;
  TVector3<double>::TVector3(&this->savedViewPos);
  TAngle<double>::TAngle(&this->savedAngle);
  TFlags<ActorRenderFlag,_unsigned_int>::TFlags(&this->savedvisibility);
  local_38 = this->savedviewpath;
  do {
    TVector3<double>::TVector3(local_38);
    local_38 = local_38 + 1;
  } while (local_38 != (TVector3<double> *)&this->PrevPortal);
  TArray<unsigned_char,_unsigned_char>::TArray(&this->savedmapsection);
  TArray<unsigned_int,_unsigned_int>::TArray(&this->mPrimIndices);
  TArray<GLWall,_GLWall>::TArray(&this->lines);
  if ((local_11 & 1) == 0) {
    local_30[0] = this;
    TArray<GLPortal_*,_GLPortal_*>::Push(&portals,local_30);
  }
  return;
}

Assistant:

GLPortal(bool local = false) { if (!local) portals.Push(this); }